

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CS248::Application::load(Application *this,SceneInfo *sceneInfo)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  Type TVar4;
  PolymeshInfo *polymesh;
  double theta;
  double dVar5;
  Scene *pSVar6;
  Matrix4x4 *transform;
  long lVar7;
  Application *this_00;
  pointer pNVar8;
  Matrix4x4 *transform_00;
  ulong uVar9;
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  objects;
  vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  lights;
  Vector3D camPos;
  BBox bbox;
  double local_180;
  double local_178;
  double local_170;
  double local_160;
  undefined1 local_158 [16];
  pointer local_148;
  double local_140;
  undefined1 local_138 [8];
  SceneObject **ppSStack_130;
  Scene *local_128;
  undefined1 local_118 [8];
  SceneLight **ppSStack_110;
  Scene *local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double dStack_e8;
  pointer local_e0;
  double local_d8;
  double dStack_d0;
  pointer local_c8;
  double local_b8;
  PolymeshInfo *local_b0;
  BBox local_a8;
  vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  local_60;
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  local_48;
  
  local_d8 = 0.0;
  dStack_d0 = 0.0;
  local_c8 = (pointer)0x0;
  local_108 = (Scene *)0x0;
  local_118 = (undefined1  [8])0x0;
  ppSStack_110 = (SceneLight **)0x0;
  local_128 = (Scene *)0x0;
  local_138 = (undefined1  [8])0x0;
  ppSStack_130 = (SceneObject **)0x0;
  pNVar8 = (sceneInfo->nodes).
           super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((sceneInfo->nodes).
      super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>._M_impl.
      super__Vector_impl_data._M_finish == pNVar8) {
    local_178 = 0.0;
    local_180 = 0.0;
    local_170 = 0.0;
  }
  else {
    local_170 = 0.0;
    lVar7 = 0x48;
    uVar9 = 0;
    local_180 = 0.0;
    local_178 = 0.0;
    this_00 = this;
    do {
      polymesh = *(PolymeshInfo **)((long)(pNVar8->transform).entries + lVar7 + -0x50);
      transform_00 = (Matrix4x4 *)((long)(pNVar8->transform).entries + lVar7 + -0x48);
      TVar4 = (polymesh->super_Instance).type;
      if (TVar4 == POLYMESH) {
        local_a8.max.x = (double)initPolymesh(this_00,polymesh,transform_00);
        if ((Scene *)ppSStack_130 == local_128) {
          this_00 = (Application *)local_138;
          std::
          vector<CS248::DynamicScene::SceneObject*,std::allocator<CS248::DynamicScene::SceneObject*>>
          ::_M_realloc_insert<CS248::DynamicScene::SceneObject*>
                    ((vector<CS248::DynamicScene::SceneObject*,std::allocator<CS248::DynamicScene::SceneObject*>>
                      *)this_00,(iterator)ppSStack_130,(SceneObject **)&local_a8);
        }
        else {
          *ppSStack_130 = (SceneObject *)local_a8.max.x;
          ppSStack_130 = ppSStack_130 + 1;
        }
      }
      else if (TVar4 == LIGHT) {
        local_a8.max.x = (double)initLight(this_00,(LightInfo *)polymesh,transform_00);
        if ((Scene *)ppSStack_110 == local_108) {
          this_00 = (Application *)local_118;
          std::
          vector<CS248::DynamicScene::SceneLight*,std::allocator<CS248::DynamicScene::SceneLight*>>
          ::_M_realloc_insert<CS248::DynamicScene::SceneLight*>
                    ((vector<CS248::DynamicScene::SceneLight*,std::allocator<CS248::DynamicScene::SceneLight*>>
                      *)this_00,(iterator)ppSStack_110,(SceneLight **)&local_a8);
        }
        else {
          *ppSStack_110 = (SceneLight *)local_a8.max.x;
          ppSStack_110 = ppSStack_110 + 1;
        }
      }
      else if (TVar4 == CAMERA) {
        local_158._0_8_ =
             (polymesh->vertices).
             super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_158._8_8_ =
             (polymesh->vertices).
             super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_148 = (polymesh->vertices).
                    super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        local_140 = 1.0;
        Matrix4x4::operator*(transform_00,(Vector4D *)local_158);
        Vector4D::to3D((Vector4D *)&local_a8);
        local_c8 = local_e0;
        local_d8 = local_f0;
        dStack_d0 = dStack_e8;
        local_158._0_8_ =
             (polymesh->normals).
             super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_158._8_8_ =
             (polymesh->normals).
             super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_148 = (polymesh->normals).
                    super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        local_140 = 1.0;
        Matrix4x4::operator*(transform_00,(Vector4D *)local_158);
        Vector4D::to3D((Vector4D *)&local_a8);
        pVVar1 = local_e0;
        local_180 = dStack_e8;
        local_170 = local_f0;
        this_00 = this;
        initCamera(this,(CameraInfo *)polymesh,transform);
        local_178 = 1.0 / SQRT((double)pVVar1 * (double)pVVar1 +
                               local_170 * local_170 + local_180 * local_180);
        local_170 = local_170 * local_178;
        local_180 = local_180 * local_178;
        local_178 = local_178 * (double)pVVar1;
        local_b0 = polymesh;
      }
      uVar9 = uVar9 + 1;
      pNVar8 = (sceneInfo->nodes).
               super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 200;
    } while (uVar9 < (ulong)(((long)(sceneInfo->nodes).
                                    super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar8 >> 3)
                            * -0x70a3d70a3d70a3d7));
  }
  pSVar6 = (Scene *)operator_new(0x630);
  std::
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>::
  vector(&local_48,
         (vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
          *)local_138);
  std::vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ::vector(&local_60,
           (vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
            *)local_118);
  DynamicScene::Scene::Scene(pSVar6,&local_48,&local_60,&sceneInfo->base_shader_dir);
  this->scene = pSVar6;
  if (local_60.
      super__Vector_base<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.
      super__Vector_base<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  pSVar6 = this->scene;
  pSVar6->camera_ = &this->camera;
  DynamicScene::Scene::getBBox(&local_a8,pSVar6);
  if (((local_a8.min.x <= local_a8.max.x) && (local_a8.min.y <= local_a8.max.y)) &&
     (local_a8.min.z <= local_a8.max.z)) {
    local_148 = (pointer)((local_a8.min.z + local_a8.max.z) * 0.5);
    dVar5 = (local_a8.max.y + local_a8.min.y) * 0.5;
    local_158._8_4_ = SUB84(dVar5,0);
    local_158._0_8_ = (local_a8.max.x + local_a8.min.x) * 0.5;
    local_158._12_4_ = (int)((ulong)dVar5 >> 0x20);
    local_f8 = SQRT(local_a8.extent.z * local_a8.extent.z +
                    local_a8.extent.x * local_a8.extent.x + local_a8.extent.y * local_a8.extent.y) *
               0.5 * 1.5;
    this->canonicalViewDistance = local_f8;
    local_100 = local_f8 / 10.0;
    local_160 = local_f8 + local_f8;
    local_f8 = local_f8 * 20.0;
    local_b8 = acos(local_180);
    dVar5 = atan2(local_170,local_178);
    Camera::place(&this->canonicalCamera,(Vector3D *)local_158,local_b8,dVar5,local_160,local_100,
                  local_f8);
    if (*(char *)&(local_b0->polygons).
                  super__Vector_base<CS248::Collada::Polygon,_std::allocator<CS248::Collada::Polygon>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
      local_148 = local_c8;
      local_158._8_8_ = dStack_d0;
      local_158._0_8_ = local_d8;
      pVVar1 = (local_b0->normals).
               super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar2 = (local_b0->normals).
               super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pVVar3 = (local_b0->normals).
               super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      local_160 = SQRT((double)pVVar3 * (double)pVVar3 +
                       (double)pVVar1 * (double)pVVar1 + (double)pVVar2 * (double)pVVar2);
    }
    dVar5 = acos(local_180);
    theta = atan2(local_170,local_178);
    Camera::place(&this->camera,(Vector3D *)local_158,dVar5,theta,local_160,local_100,local_f8);
    this->scrollRate = this->canonicalViewDistance / 10.0;
  }
  if (local_138 != (undefined1  [8])0x0) {
    operator_delete((void *)local_138);
  }
  if (local_118 != (undefined1  [8])0x0) {
    operator_delete((void *)local_118);
  }
  return;
}

Assistant:

void Application::load(SceneInfo* sceneInfo) {

    // save camera position to update camera control later
    CameraInfo* camInfo;
    Vector3D camPos, camDir;
 
    vector<DynamicScene::SceneLight*> lights;
    vector<DynamicScene::SceneObject*> objects;

    vector<Collada::Node>& nodes = sceneInfo->nodes;

    for (size_t i=0; i<nodes.size(); i++) {
        Collada::Node& node = nodes[i];
        Collada::Instance* instance = node.instance;
        const Matrix4x4& transform = node.transform;

        switch (instance->type) {
          case Collada::Instance::CAMERA: {
              // printf("Creating camera\n"); fflush(stdout);
              camInfo = static_cast<CameraInfo*>(instance);
              camPos = (transform * Vector4D(camInfo->pos, 1)).to3D();
              camDir = (transform * Vector4D(camInfo->view_dir, 1)).to3D().unit();
              initCamera(*camInfo, transform);
              break;
          }
          case Collada::Instance::LIGHT: {
              // printf("Creating light\n"); fflush(stdout);  
              lights.push_back(
                  initLight(static_cast<LightInfo&>(*instance), transform));
              break;
          }
          case Collada::Instance::POLYMESH: {
              // printf("Creating mesh\n"); fflush(stdout);  
              objects.push_back(
                  initPolymesh(static_cast<PolymeshInfo&>(*instance), transform));
              break;
          }
        default:
            // unsupported instance type
            break;
        }
    }

    // create the scene
    scene = new DynamicScene::Scene(objects, lights, sceneInfo->base_shader_dir);
    scene->setCamera(&camera);  

    // given the size of the scene, determine a "canonical" camera position that's
    // outside the bounds of the scene's geometry
    BBox bbox = scene->getBBox();
    if (!bbox.empty()) {
        Vector3D target = bbox.centroid();
        canonicalViewDistance = bbox.extent.norm() / 2.0 * 1.5;

        double viewDistance = canonicalViewDistance * 2;
        double minViewDistance = canonicalViewDistance / 10.0;
        double maxViewDistance = canonicalViewDistance * 20.0;

      	canonicalCamera.place(target, acos(camDir.y), atan2(camDir.x, camDir.z),
                              viewDistance, minViewDistance, maxViewDistance);

    	  if (!camInfo->default_flag) {
		        target = camPos;
		        viewDistance = camInfo->view_dir.norm();
        }

        camera.place(target, acos(camDir.y), atan2(camDir.x, camDir.z),
                     viewDistance, minViewDistance, maxViewDistance);

        setScrollRate();
    }
}